

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_coin_selection.cpp
# Opt level: O3

void __thiscall
CoinSelection_SelectCoins_with_multiple_asset_fee_only_target_Test::TestBody
          (CoinSelection_SelectCoins_with_multiple_asset_fee_only_target_Test *this)

{
  pointer *ppuVar1;
  uint64_t *puVar2;
  uint32_t vout;
  pointer pTVar3;
  bool bVar4;
  byte bVar5;
  mapped_type *pmVar6;
  mapped_type_conflict *pmVar7;
  pointer hex;
  _func_int **pp_Var8;
  char *pcVar9;
  CoinSelectionOption *in_R9;
  pointer puVar10;
  pointer utxo;
  pointer puVar11;
  Amount AVar12;
  AssertHelper local_1e8;
  Txid txid;
  AssertionResult gtest_ar_7;
  pointer local_1a8;
  AssertHelper local_1a0;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> utxos;
  CoinSelectionOption option;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  map_searched_bnb;
  Amount local_e0;
  Amount fee;
  AmountMap map_select_value;
  AmountMap map_target_amount;
  CoinSelection local_60;
  
  cfd::CoinSelection::CoinSelection(&local_60,true);
  map_target_amount._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &map_target_amount._M_t._M_impl.super__Rb_tree_header._M_header;
  map_target_amount._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  map_target_amount._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  map_target_amount._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  map_target_amount._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       map_target_amount._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)&option,&exp_dummy_asset_a);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
           ::operator[](&map_target_amount,(key_type *)&option);
  *pmVar6 = 0x5f5db24;
  puVar2 = &option.effective_fee_baserate_;
  if ((uint64_t *)option._0_8_ != puVar2) {
    operator_delete((void *)option._0_8_,option.effective_fee_baserate_ + 1);
  }
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)&option,&exp_dummy_asset_b);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
           ::operator[](&map_target_amount,(key_type *)&option);
  *pmVar6 = 0x14a7184a;
  if ((uint64_t *)option._0_8_ != puVar2) {
    operator_delete((void *)option._0_8_,option.effective_fee_baserate_ + 1);
  }
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)&option,&exp_dummy_asset_c);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
           ::operator[](&map_target_amount,(key_type *)&option);
  *pmVar6 = 0;
  if ((uint64_t *)option._0_8_ != puVar2) {
    operator_delete((void *)option._0_8_,option.effective_fee_baserate_ + 1);
  }
  map_select_value._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &map_select_value._M_t._M_impl.super__Rb_tree_header._M_header;
  map_select_value._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  map_select_value._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  map_select_value._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  map_select_value._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       map_select_value._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  cfd::core::Amount::Amount(&fee);
  AVar12 = cfd::core::Amount::CreateBySatoshiAmount(500);
  local_e0.amount_ = AVar12.amount_;
  local_e0.ignore_check_ = AVar12.ignore_check_;
  map_searched_bnb._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &map_searched_bnb._M_t._M_impl.super__Rb_tree_header._M_header;
  map_searched_bnb._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  map_searched_bnb._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  map_searched_bnb._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  map_searched_bnb._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       map_searched_bnb._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  GetElementsOption();
  cfd::CoinSelectionOption::SetEffectiveFeeBaserate(&option,2.0);
  cfd::CoinSelectionOption::SetFeeAsset(&option,&exp_dummy_asset_c);
  utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::resize
            (&utxos,((long)kExtCoinSelectElementsTestVector.
                           super__Vector_base<TestElementsUtxoCoinVector,_std::allocator<TestElementsUtxoCoinVector>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)kExtCoinSelectElementsTestVector.
                           super__Vector_base<TestElementsUtxoCoinVector,_std::allocator<TestElementsUtxoCoinVector>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7);
  pTVar3 = kExtCoinSelectElementsTestVector.
           super__Vector_base<TestElementsUtxoCoinVector,_std::allocator<TestElementsUtxoCoinVector>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (kExtCoinSelectElementsTestVector.
      super__Vector_base<TestElementsUtxoCoinVector,_std::allocator<TestElementsUtxoCoinVector>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      kExtCoinSelectElementsTestVector.
      super__Vector_base<TestElementsUtxoCoinVector,_std::allocator<TestElementsUtxoCoinVector>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    hex = kExtCoinSelectElementsTestVector.
          super__Vector_base<TestElementsUtxoCoinVector,_std::allocator<TestElementsUtxoCoinVector>_>
          ._M_impl.super__Vector_impl_data._M_start;
    utxo = utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
           super__Vector_impl_data._M_start;
    do {
      cfd::core::Txid::Txid(&txid);
      if ((hex->txid)._M_string_length != 0) {
        cfd::core::Txid::Txid((Txid *)&gtest_ar_7,&hex->txid);
        cfd::core::Txid::operator=(&txid,(Txid *)&gtest_ar_7);
        gtest_ar_7._0_8_ = &PTR__Txid_0086d9f8;
        if (gtest_ar_7.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          operator_delete(gtest_ar_7.message_.ptr_,(long)local_1a8 - (long)gtest_ar_7.message_.ptr_)
          ;
        }
      }
      vout = hex->vout;
      AVar12 = cfd::core::Amount::CreateBySatoshiAmount(hex->amount);
      gtest_ar_7._0_8_ = AVar12.amount_;
      gtest_ar_7.message_.ptr_._0_1_ = AVar12.ignore_check_;
      in_R9 = (CoinSelectionOption *)0x0;
      cfd::CoinSelection::ConvertToUtxo
                (&txid,vout,&hex->descriptor,(Amount *)&gtest_ar_7,&hex->asset,(void *)0x0,utxo,
                 (Script *)0x0);
      txid._vptr_Txid = (_func_int **)&PTR__Txid_0086d9f8;
      if (txid.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
          .super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(txid.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)txid.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)txid.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      utxo = utxo + 1;
      hex = hex + 1;
    } while (hex != pTVar3);
  }
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    bVar4 = testing::internal::AlwaysTrue();
    pp_Var8 = (_func_int **)0x0;
    puVar10 = (pointer)0x0;
    puVar11 = (pointer)0x0;
    if (bVar4) {
      in_R9 = &option;
      cfd::CoinSelection::SelectCoins
                ((vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)&txid,&local_60,&map_target_amount
                 ,&utxos,&exp_filter,in_R9,&local_e0,&map_select_value,&fee,&map_searched_bnb,
                 (AmountMap *)0x0);
      pp_Var8 = txid._vptr_Txid;
      puVar10 = txid.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start;
      puVar11 = txid.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    }
  }
  else {
    testing::Message::Message((Message *)&txid);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x532,
               "Expected: ret = coin_select.SelectCoins( map_target_amount, utxos, exp_filter, option, tx_fee, &map_select_value, &fee, &map_searched_bnb) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7,(Message *)&txid);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7);
    if (txid._vptr_Txid != (_func_int **)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (txid._vptr_Txid != (_func_int **)0x0)) {
        (**(code **)(*txid._vptr_Txid + 8))();
      }
    }
    pp_Var8 = (_func_int **)0x0;
    puVar10 = (pointer)0x0;
    puVar11 = (pointer)0x0;
  }
  gtest_ar_7._0_8_ = ((long)puVar10 - (long)pp_Var8 >> 3) * -0x7b425ed097b425ed;
  local_1e8.data_._0_4_ = 5;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&txid,"ret.size()","5",(unsigned_long *)&gtest_ar_7,(int *)&local_1e8);
  if ((char)txid._vptr_Txid == '\0') {
    testing::Message::Message((Message *)&gtest_ar_7);
    if (txid.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = *(char **)txid.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x534,pcVar9);
    testing::internal::AssertHelper::operator=(&local_1e8,(Message *)&gtest_ar_7);
    testing::internal::AssertHelper::~AssertHelper(&local_1e8);
    if (gtest_ar_7._0_8_ != 0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (gtest_ar_7._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar_7._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&txid.data_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if ((long)puVar10 - (long)pp_Var8 == 0x438) {
    gtest_ar_7._0_8_ = &DAT_0511f364;
    testing::internal::CmpHelperEQ<unsigned_long,long>
              ((internal *)&txid,"ret[0].amount","static_cast<int64_t>(85062500)",
               (unsigned_long *)(pp_Var8 + 0x10),(long *)&gtest_ar_7);
    if ((char)txid._vptr_Txid == '\0') {
      testing::Message::Message((Message *)&gtest_ar_7);
      if (txid.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
          .super__Vector_impl_data._M_start == (pointer)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = *(char **)txid.data_.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_1e8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
                 ,0x536,pcVar9);
      testing::internal::AssertHelper::operator=(&local_1e8,(Message *)&gtest_ar_7);
      testing::internal::AssertHelper::~AssertHelper(&local_1e8);
      if (gtest_ar_7._0_8_ != 0) {
        bVar4 = testing::internal::IsTrue(true);
        if ((bVar4) && (gtest_ar_7._0_8_ != 0)) {
          (**(code **)(*(long *)gtest_ar_7._0_8_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&txid.data_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    gtest_ar_7._0_8_ = &DAT_00e3f1de;
    testing::internal::CmpHelperEQ<unsigned_long,long>
              ((internal *)&txid,"ret[1].amount","static_cast<int64_t>(14938590)",
               (unsigned_long *)(pp_Var8 + 0x2b),(long *)&gtest_ar_7);
    if ((char)txid._vptr_Txid == '\0') {
      testing::Message::Message((Message *)&gtest_ar_7);
      if (txid.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
          .super__Vector_impl_data._M_start == (pointer)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = *(char **)txid.data_.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_1e8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
                 ,0x537,pcVar9);
      testing::internal::AssertHelper::operator=(&local_1e8,(Message *)&gtest_ar_7);
      testing::internal::AssertHelper::~AssertHelper(&local_1e8);
      if (gtest_ar_7._0_8_ != 0) {
        bVar4 = testing::internal::IsTrue(true);
        if ((bVar4) && (gtest_ar_7._0_8_ != 0)) {
          (**(code **)(*(long *)gtest_ar_7._0_8_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&txid.data_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    gtest_ar_7._0_8_ = &DAT_14a61a62;
    testing::internal::CmpHelperEQ<unsigned_long,long>
              ((internal *)&txid,"ret[2].amount","static_cast<int64_t>(346430050)",
               (unsigned_long *)(pp_Var8 + 0x46),(long *)&gtest_ar_7);
    if ((char)txid._vptr_Txid == '\0') {
      testing::Message::Message((Message *)&gtest_ar_7);
      if (txid.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
          .super__Vector_impl_data._M_start == (pointer)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = *(char **)txid.data_.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_1e8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
                 ,0x538,pcVar9);
      testing::internal::AssertHelper::operator=(&local_1e8,(Message *)&gtest_ar_7);
      testing::internal::AssertHelper::~AssertHelper(&local_1e8);
      if (gtest_ar_7._0_8_ != 0) {
        bVar4 = testing::internal::IsTrue(true);
        if ((bVar4) && (gtest_ar_7._0_8_ != 0)) {
          (**(code **)(*(long *)gtest_ar_7._0_8_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&txid.data_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    gtest_ar_7._0_8_ = &DAT_000b71b0;
    testing::internal::CmpHelperEQ<unsigned_long,long>
              ((internal *)&txid,"ret[3].amount","static_cast<int64_t>(750000)",
               (unsigned_long *)(pp_Var8 + 0x61),(long *)&gtest_ar_7);
    if ((char)txid._vptr_Txid == '\0') {
      testing::Message::Message((Message *)&gtest_ar_7);
      if (txid.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
          .super__Vector_impl_data._M_start == (pointer)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = *(char **)txid.data_.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_1e8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
                 ,0x539,pcVar9);
      testing::internal::AssertHelper::operator=(&local_1e8,(Message *)&gtest_ar_7);
      testing::internal::AssertHelper::~AssertHelper(&local_1e8);
      if (gtest_ar_7._0_8_ != 0) {
        bVar4 = testing::internal::IsTrue(true);
        if ((bVar4) && (gtest_ar_7._0_8_ != 0)) {
          (**(code **)(*(long *)gtest_ar_7._0_8_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&txid.data_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    gtest_ar_7._0_8_ = &DAT_023e8eb8;
    testing::internal::CmpHelperEQ<unsigned_long,long>
              ((internal *)&txid,"ret[4].amount","static_cast<int64_t>(37654200)",
               (unsigned_long *)(pp_Var8 + 0x7c),(long *)&gtest_ar_7);
    if ((char)txid._vptr_Txid == '\0') {
      testing::Message::Message((Message *)&gtest_ar_7);
      if (txid.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
          .super__Vector_impl_data._M_start == (pointer)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = *(char **)txid.data_.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_1e8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
                 ,0x53a,pcVar9);
      testing::internal::AssertHelper::operator=(&local_1e8,(Message *)&gtest_ar_7);
      testing::internal::AssertHelper::~AssertHelper(&local_1e8);
      if (gtest_ar_7._0_8_ != 0) {
        bVar4 = testing::internal::IsTrue(true);
        if ((bVar4) && (gtest_ar_7._0_8_ != 0)) {
          (**(code **)(*(long *)gtest_ar_7._0_8_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&txid.data_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  gtest_ar_7._0_8_ = map_select_value._M_t._M_impl.super__Rb_tree_header._M_node_count;
  local_1e8.data_._0_4_ = 3;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&txid,"map_select_value.size()","3",(unsigned_long *)&gtest_ar_7,
             (int *)&local_1e8);
  if ((char)txid._vptr_Txid == '\0') {
    testing::Message::Message((Message *)&gtest_ar_7);
    if (txid.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = *(char **)txid.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x53c,pcVar9);
    testing::internal::AssertHelper::operator=(&local_1e8,(Message *)&gtest_ar_7);
    testing::internal::AssertHelper::~AssertHelper(&local_1e8);
    if (gtest_ar_7._0_8_ != 0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (gtest_ar_7._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar_7._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&txid.data_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (map_select_value._M_t._M_impl.super__Rb_tree_header._M_node_count == 3) {
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)&txid,&exp_dummy_asset_a);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
             ::operator[](&map_select_value,(key_type *)&txid);
    local_1e8.data_._0_4_ = 0x5f5e542;
    testing::internal::CmpHelperEQ<long,int>
              ((internal *)&gtest_ar_7,"map_select_value[exp_dummy_asset_a.GetHex()]","100001090",
               pmVar6,(int *)&local_1e8);
    ppuVar1 = &txid.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    if (txid._vptr_Txid != (_func_int **)ppuVar1) {
      operator_delete(txid._vptr_Txid,
                      (ulong)(txid.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish + 1));
    }
    if (gtest_ar_7.success_ == false) {
      testing::Message::Message((Message *)&txid);
      if (gtest_ar_7.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = ((gtest_ar_7.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_1e8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
                 ,0x53e,pcVar9);
      testing::internal::AssertHelper::operator=(&local_1e8,(Message *)&txid);
      testing::internal::AssertHelper::~AssertHelper(&local_1e8);
      if (txid._vptr_Txid != (_func_int **)0x0) {
        bVar4 = testing::internal::IsTrue(true);
        if ((bVar4) && (txid._vptr_Txid != (_func_int **)0x0)) {
          (**(code **)(*txid._vptr_Txid + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar_7.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)&txid,&exp_dummy_asset_b);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
             ::operator[](&map_select_value,(key_type *)&txid);
    local_1e8.data_._0_4_ = 0x14b18c12;
    testing::internal::CmpHelperEQ<long,int>
              ((internal *)&gtest_ar_7,"map_select_value[exp_dummy_asset_b.GetHex()]","347180050",
               pmVar6,(int *)&local_1e8);
    if (txid._vptr_Txid != (_func_int **)ppuVar1) {
      operator_delete(txid._vptr_Txid,
                      (ulong)(txid.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish + 1));
    }
    if (gtest_ar_7.success_ == false) {
      testing::Message::Message((Message *)&txid);
      if (gtest_ar_7.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = ((gtest_ar_7.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_1e8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
                 ,0x53f,pcVar9);
      testing::internal::AssertHelper::operator=(&local_1e8,(Message *)&txid);
      testing::internal::AssertHelper::~AssertHelper(&local_1e8);
      if (txid._vptr_Txid != (_func_int **)0x0) {
        bVar4 = testing::internal::IsTrue(true);
        if ((bVar4) && (txid._vptr_Txid != (_func_int **)0x0)) {
          (**(code **)(*txid._vptr_Txid + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar_7.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)&txid,&exp_dummy_asset_c);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
             ::operator[](&map_select_value,(key_type *)&txid);
    local_1e8.data_._0_4_ = 0x23e8eb8;
    testing::internal::CmpHelperEQ<long,int>
              ((internal *)&gtest_ar_7,"map_select_value[exp_dummy_asset_c.GetHex()]","37654200",
               pmVar6,(int *)&local_1e8);
    if (txid._vptr_Txid != (_func_int **)ppuVar1) {
      operator_delete(txid._vptr_Txid,
                      (ulong)(txid.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish + 1));
    }
    if (gtest_ar_7.success_ == false) {
      testing::Message::Message((Message *)&txid);
      if (gtest_ar_7.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = ((gtest_ar_7.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_1e8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
                 ,0x540,pcVar9);
      testing::internal::AssertHelper::operator=(&local_1e8,(Message *)&txid);
      testing::internal::AssertHelper::~AssertHelper(&local_1e8);
      if (txid._vptr_Txid != (_func_int **)0x0) {
        bVar4 = testing::internal::IsTrue(true);
        if ((bVar4) && (txid._vptr_Txid != (_func_int **)0x0)) {
          (**(code **)(*txid._vptr_Txid + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar_7.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  gtest_ar_7._0_8_ = cfd::core::Amount::GetSatoshiValue(&fee);
  local_1e8.data_._0_4_ = 0x398;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)&txid,"fee.GetSatoshiValue()","920",(long *)&gtest_ar_7,(int *)&local_1e8);
  if ((char)txid._vptr_Txid == '\0') {
    testing::Message::Message((Message *)&gtest_ar_7);
    if (txid.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = *(char **)txid.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x542,pcVar9);
    testing::internal::AssertHelper::operator=(&local_1e8,(Message *)&gtest_ar_7);
    testing::internal::AssertHelper::~AssertHelper(&local_1e8);
    if (gtest_ar_7._0_8_ != 0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (gtest_ar_7._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar_7._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&txid.data_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  gtest_ar_7._0_8_ = map_searched_bnb._M_t._M_impl.super__Rb_tree_header._M_node_count;
  local_1e8.data_._0_4_ = 3;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&txid,"map_searched_bnb.size()","3",(unsigned_long *)&gtest_ar_7,
             (int *)&local_1e8);
  if ((char)txid._vptr_Txid == '\0') {
    testing::Message::Message((Message *)&gtest_ar_7);
    if (txid.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = *(char **)txid.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x543,pcVar9);
    testing::internal::AssertHelper::operator=(&local_1e8,(Message *)&gtest_ar_7);
    testing::internal::AssertHelper::~AssertHelper(&local_1e8);
    if (gtest_ar_7._0_8_ != 0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (gtest_ar_7._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar_7._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&txid.data_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (map_searched_bnb._M_t._M_impl.super__Rb_tree_header._M_node_count == 3) {
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)&txid,&exp_dummy_asset_a);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
             ::operator[](&map_searched_bnb,(key_type *)&txid);
    gtest_ar_7.success_ = *pmVar7;
    gtest_ar_7.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    ppuVar1 = &txid.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    bVar5 = *pmVar7;
    if (txid._vptr_Txid != (_func_int **)ppuVar1) {
      operator_delete(txid._vptr_Txid,
                      (ulong)(txid.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish + 1));
      bVar5 = gtest_ar_7.success_;
    }
    if ((bVar5 & 1) == 0) {
      testing::Message::Message((Message *)&local_1e8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&txid,(internal *)&gtest_ar_7,
                 (AssertionResult *)"map_searched_bnb[exp_dummy_asset_a.GetHex()]","false","true",
                 &in_R9->use_bnb_);
      testing::internal::AssertHelper::AssertHelper
                (&local_1a0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
                 ,0x545,(char *)txid._vptr_Txid);
      testing::internal::AssertHelper::operator=(&local_1a0,(Message *)&local_1e8);
      testing::internal::AssertHelper::~AssertHelper(&local_1a0);
      if (txid._vptr_Txid != (_func_int **)ppuVar1) {
        operator_delete(txid._vptr_Txid,
                        (ulong)(txid.data_.data_.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish + 1));
      }
      if (CONCAT44(local_1e8.data_._4_4_,local_1e8.data_._0_4_) != 0) {
        bVar4 = testing::internal::IsTrue(true);
        if ((bVar4) &&
           ((long *)CONCAT44(local_1e8.data_._4_4_,local_1e8.data_._0_4_) != (long *)0x0)) {
          (**(code **)(*(long *)CONCAT44(local_1e8.data_._4_4_,local_1e8.data_._0_4_) + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar_7.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)&txid,&exp_dummy_asset_b);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
             ::operator[](&map_searched_bnb,(key_type *)&txid);
    gtest_ar_7._0_8_ = CONCAT71(gtest_ar_7._1_7_,*pmVar7) ^ 1;
    gtest_ar_7.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    bVar5 = *pmVar7 ^ 1;
    if (txid._vptr_Txid != (_func_int **)ppuVar1) {
      operator_delete(txid._vptr_Txid,
                      (ulong)(txid.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish + 1));
      bVar5 = gtest_ar_7.success_;
    }
    if ((bVar5 & 1) == 0) {
      testing::Message::Message((Message *)&local_1e8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&txid,(internal *)&gtest_ar_7,
                 (AssertionResult *)"map_searched_bnb[exp_dummy_asset_b.GetHex()]","true","false",
                 &in_R9->use_bnb_);
      testing::internal::AssertHelper::AssertHelper
                (&local_1a0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
                 ,0x546,(char *)txid._vptr_Txid);
      testing::internal::AssertHelper::operator=(&local_1a0,(Message *)&local_1e8);
      testing::internal::AssertHelper::~AssertHelper(&local_1a0);
      if (txid._vptr_Txid != (_func_int **)ppuVar1) {
        operator_delete(txid._vptr_Txid,
                        (ulong)(txid.data_.data_.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish + 1));
      }
      if (CONCAT44(local_1e8.data_._4_4_,local_1e8.data_._0_4_) != 0) {
        bVar4 = testing::internal::IsTrue(true);
        if ((bVar4) &&
           ((long *)CONCAT44(local_1e8.data_._4_4_,local_1e8.data_._0_4_) != (long *)0x0)) {
          (**(code **)(*(long *)CONCAT44(local_1e8.data_._4_4_,local_1e8.data_._0_4_) + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar_7.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)&txid,&exp_dummy_asset_c);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
             ::operator[](&map_searched_bnb,(key_type *)&txid);
    gtest_ar_7._0_8_ = CONCAT71(gtest_ar_7._1_7_,*pmVar7) ^ 1;
    gtest_ar_7.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    bVar5 = *pmVar7 ^ 1;
    if (txid._vptr_Txid != (_func_int **)ppuVar1) {
      operator_delete(txid._vptr_Txid,
                      (ulong)(txid.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish + 1));
      bVar5 = gtest_ar_7.success_;
    }
    if ((bVar5 & 1) == 0) {
      testing::Message::Message((Message *)&local_1e8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&txid,(internal *)&gtest_ar_7,
                 (AssertionResult *)"map_searched_bnb[exp_dummy_asset_c.GetHex()]","true","false",
                 &in_R9->use_bnb_);
      testing::internal::AssertHelper::AssertHelper
                (&local_1a0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
                 ,0x547,(char *)txid._vptr_Txid);
      testing::internal::AssertHelper::operator=(&local_1a0,(Message *)&local_1e8);
      testing::internal::AssertHelper::~AssertHelper(&local_1a0);
      if (txid._vptr_Txid != (_func_int **)ppuVar1) {
        operator_delete(txid._vptr_Txid,
                        (ulong)(txid.data_.data_.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish + 1));
      }
      if (CONCAT44(local_1e8.data_._4_4_,local_1e8.data_._0_4_) != 0) {
        bVar4 = testing::internal::IsTrue(true);
        if ((bVar4) &&
           ((long *)CONCAT44(local_1e8.data_._4_4_,local_1e8.data_._0_4_) != (long *)0x0)) {
          (**(code **)(*(long *)CONCAT44(local_1e8.data_._4_4_,local_1e8.data_._0_4_) + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar_7.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  if (pp_Var8 != (_func_int **)0x0) {
    operator_delete(pp_Var8,(long)puVar11 - (long)pp_Var8);
  }
  if (utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  option.fee_asset_._vptr_ConfidentialAssetId = (_func_int **)&PTR__ConfidentialAssetId_0086dd08;
  if (option.fee_asset_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(option.fee_asset_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)option.fee_asset_.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)option.fee_asset_.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::~_Rb_tree(&map_searched_bnb._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
  ::~_Rb_tree(&map_select_value._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
  ::~_Rb_tree(&map_target_amount._M_t);
  if (local_60.randomize_cache_.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_60.randomize_cache_.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_60.randomize_cache_.super__Bvector_base<std::allocator<bool>_>.
                          _M_impl.super__Bvector_impl_data._M_end_of_storage -
                    (long)local_60.randomize_cache_.super__Bvector_base<std::allocator<bool>_>.
                          _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  return;
}

Assistant:

TEST(CoinSelection, SelectCoins_with_multiple_asset_fee_only_target)
{
  CoinSelection coin_select(true);
  // Same condition with "SelectCoins_SelectCoinsBnB"
  AmountMap map_target_amount;
  map_target_amount[exp_dummy_asset_a.GetHex()] = 99998500;
  map_target_amount[exp_dummy_asset_b.GetHex()] = 346495050;
  map_target_amount[exp_dummy_asset_c.GetHex()] = 0;
  AmountMap map_select_value;
  Amount fee;
  Amount tx_fee = Amount::CreateBySatoshiAmount(500);
  std::map<std::string, bool> map_searched_bnb;
  CoinSelectionOption option = GetElementsOption();
  option.SetEffectiveFeeBaserate(2);
  option.SetFeeAsset(exp_dummy_asset_c);

  std::vector<Utxo> utxos;
  utxos.resize(kExtCoinSelectElementsTestVector.size());
  std::vector<Utxo>::iterator ite = utxos.begin();
  for (const auto& test_data : kExtCoinSelectElementsTestVector) {
    Txid txid;
    if (!test_data.txid.empty()) {
      txid = Txid(test_data.txid);
    }
    CoinSelection::ConvertToUtxo(
        txid, test_data.vout, test_data.descriptor,
        Amount::CreateBySatoshiAmount(test_data.amount), test_data.asset, nullptr,
        &(*ite));
    ++ite;
  }

  std::vector<Utxo> ret;
  EXPECT_NO_THROW(ret = coin_select.SelectCoins(
      map_target_amount, utxos, exp_filter, option,
      tx_fee, &map_select_value, &fee, &map_searched_bnb));

  EXPECT_EQ(ret.size(), 5);
  if (ret.size() == 5) {
    EXPECT_EQ(ret[0].amount, static_cast<int64_t>(85062500));
    EXPECT_EQ(ret[1].amount, static_cast<int64_t>(14938590));
    EXPECT_EQ(ret[2].amount, static_cast<int64_t>(346430050));
    EXPECT_EQ(ret[3].amount, static_cast<int64_t>(750000));
    EXPECT_EQ(ret[4].amount, static_cast<int64_t>(37654200));
  }
  EXPECT_EQ(map_select_value.size(), 3);
  if (map_select_value.size() == 3) {
    EXPECT_EQ(map_select_value[exp_dummy_asset_a.GetHex()], 100001090);
    EXPECT_EQ(map_select_value[exp_dummy_asset_b.GetHex()], 347180050);
    EXPECT_EQ(map_select_value[exp_dummy_asset_c.GetHex()], 37654200);
  }
  EXPECT_EQ(fee.GetSatoshiValue(), 920);
  EXPECT_EQ(map_searched_bnb.size(), 3);
  if (map_searched_bnb.size() == 3) {
    EXPECT_TRUE(map_searched_bnb[exp_dummy_asset_a.GetHex()]);
    EXPECT_FALSE(map_searched_bnb[exp_dummy_asset_b.GetHex()]);
    EXPECT_FALSE(map_searched_bnb[exp_dummy_asset_c.GetHex()]);
  }
}